

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderVkImpl::Initialize
          (ShaderVkImpl *this,ShaderCreateInfo *ShaderCI,CreateInfo *VkShaderCI)

{
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 *Args;
  SHADER_TYPE SVar1;
  IDXCompiler *pIVar2;
  RenderDeviceInfo *pRVar3;
  SPIRVShaderResources *this_00;
  size_type __p;
  bool bVar4;
  int iVar5;
  IMemoryAllocator *Allocator;
  undefined4 extraout_var;
  char (*Args_1) [50];
  ShaderDesc *shaderDesc;
  BuildGLSLSourceStringAttribs *extraout_RDX;
  BuildGLSLSourceStringAttribs *extraout_RDX_00;
  BuildGLSLSourceStringAttribs *Attribs;
  ShaderMacro *pSVar6;
  size_t sVar7;
  char (*in_R8) [23];
  Char *CombinedSamplerSuffix;
  string *psVar8;
  string GLSLSourceString;
  string msg;
  ShaderSourceFileData SourceData;
  string local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  STDDeleter<Diligent::SPIRVShaderResources,_Diligent::IMemoryAllocator> local_58;
  String local_50;
  
  Args_1 = (char (*) [50])((ulong)ShaderCI->FilePath | (ulong)ShaderCI->Source);
  if (Args_1 == (char (*) [50])0x0) {
    if (ShaderCI->ByteCode == (void *)0x0) {
      LogError<true,char[93]>
                (false,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                 ,0xd3,(char (*) [93])
                       "Shader source must be provided through one of the \'Source\', \'FilePath\' or \'ByteCode\' members"
                );
    }
    else {
      Args = &ShaderCI->field_4;
      sVar7 = (ShaderCI->field_4).SourceLength;
      if (sVar7 == 0) {
        FormatString<char[27]>(&msg,(char (*) [27])"ByteCodeSize must not be 0");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xcc);
        std::__cxx11::string::~string((string *)&msg);
        sVar7 = Args->SourceLength;
      }
      if ((sVar7 & 3) != 0) {
        FormatString<char[17],unsigned_long,char[23]>
                  (&msg,(Diligent *)"Byte code size (",(char (*) [17])Args,
                   (unsigned_long *)") is not multiple of 4",in_R8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xcd);
        std::__cxx11::string::~string((string *)&msg);
        sVar7 = Args->SourceLength;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_SPIRV,sVar7 >> 2);
      memcpy((this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start,ShaderCI->ByteCode,(ShaderCI->field_4).SourceLength);
    }
    goto LAB_00224c8f;
  }
  Attribs = (BuildGLSLSourceStringAttribs *)VkShaderCI;
  if (ShaderCI->ByteCode != (void *)0x0) {
    FormatString<char[74]>
              (&msg,(char (*) [74])
                    "\'ByteCode\' must be null when shader is created from source code or a file");
    Args_1 = (char (*) [50])0xa9;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0xa9);
    std::__cxx11::string::~string((string *)&msg);
    Attribs = extraout_RDX;
  }
  if (ShaderCI->ShaderCompiler < SHADER_COMPILER_DXC) {
LAB_00224a0f:
    local_98.field_2._M_allocated_capacity = 0;
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    if ((ShaderCI->SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL) &&
       ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) ==
        SHADER_COMPILE_FLAG_NONE)) {
      GLSLangUtils::HLSLtoSPIRV
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&msg,ShaderCI,Vk100,
                 "#ifndef VULKAN\n#   define VULKAN 1\n#endif\n\n",VkShaderCI->ppCompilerOutput);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,&msg);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&msg);
    }
    else {
      GLSLSourceString._M_dataplus._M_p = (pointer)&GLSLSourceString.field_2;
      GLSLSourceString._M_string_length = 0;
      GLSLSourceString.field_2._M_allocated_capacity =
           GLSLSourceString.field_2._M_allocated_capacity & 0xffffffffffffff00;
      SourceData.pFileData.m_pObject = (IDataBlob *)0x0;
      SourceData.Source = (char *)0x0;
      SourceData.SourceLength = 0;
      if (ShaderCI->SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM) {
        ReadShaderSourceFile((ShaderSourceFileData *)&msg,ShaderCI);
        ShaderSourceFileData::operator=(&SourceData,(ShaderSourceFileData *)&msg);
        RefCntAutoPtr<Diligent::IDataBlob>::Release((RefCntAutoPtr<Diligent::IDataBlob> *)&msg);
        pSVar6 = (ShaderCI->Macros).Elements;
      }
      else {
        msg._M_string_length = (size_type)VkShaderCI->AdapterInfo;
        pRVar3 = VkShaderCI->DeviceInfo;
        msg.field_2._M_allocated_capacity = (size_type)&pRVar3->Features;
        msg.field_2._8_4_ = pRVar3->Type;
        msg.field_2._12_4_ = (pRVar3->MaxShaderVersion).HLSL.Major;
        msg._M_dataplus._M_p = (pointer)ShaderCI;
        BuildGLSLSourceString_abi_cxx11_(&local_50,(Diligent *)&msg,Attribs);
        std::__cxx11::string::operator=((string *)&GLSLSourceString,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        SourceData.Source = GLSLSourceString._M_dataplus._M_p;
        msg._M_dataplus._M_p = (pointer)GLSLSourceString._M_string_length;
        SourceData.SourceLength = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg);
        pSVar6 = (ShaderMacro *)0x0;
      }
      msg._M_dataplus._M_p._0_4_ = (ShaderCI->Desc).ShaderType;
      msg._M_string_length = (size_type)SourceData.Source;
      msg.field_2._M_allocated_capacity._0_4_ = SourceData.SourceLength;
      msg.field_2._8_4_ = SUB84(pSVar6,0);
      msg.field_2._12_4_ = (undefined4)((ulong)pSVar6 >> 0x20);
      GLSLangUtils::GLSLtoSPIRV
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,
                 (GLSLtoSPIRVAttribs *)&msg);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,&local_50);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
      RefCntAutoPtr<Diligent::IDataBlob>::Release(&SourceData.pFileData);
      std::__cxx11::string::~string((string *)&GLSLSourceString);
    }
    psVar8 = &local_98;
LAB_00224c3e:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&this->m_SPIRV,psVar8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)psVar8);
  }
  else {
    if (ShaderCI->ShaderCompiler == SHADER_COMPILER_DXC) {
      if ((VkShaderCI->pDXCompiler == (IDXCompiler *)0x0) ||
         (iVar5 = (*VkShaderCI->pDXCompiler->_vptr_IDXCompiler[3])(), (char)iVar5 == '\0')) {
        FormatString<char[57]>
                  (&msg,(char (*) [57])"DX Compiler is not loaded. Using default shader compiler");
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
        Attribs = extraout_RDX_00;
        goto LAB_00224a0f;
      }
      pIVar2 = VkShaderCI->pDXCompiler;
      if ((pIVar2 == (IDXCompiler *)0x0) ||
         (iVar5 = (*pIVar2->_vptr_IDXCompiler[3])(pIVar2), (char)iVar5 == '\0')) {
        FormatString<char[26],char[50]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pDXCompiler != nullptr && pDXCompiler->IsLoaded()",Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CompileShaderDXC",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0x48);
        std::__cxx11::string::~string((string *)&msg);
      }
      GLSLSourceString._M_dataplus._M_p = (pointer)0x0;
      GLSLSourceString._M_string_length = 0;
      GLSLSourceString.field_2._M_allocated_capacity = 0;
      (*pIVar2->_vptr_IDXCompiler[6])
                (pIVar2,ShaderCI,ShaderCI->HLSLVersion,
                 "#ifndef VULKAN\n#   define VULKAN 1\n#endif\n\n",0,&GLSLSourceString,
                 VkShaderCI->ppCompilerOutput);
      if (GLSLSourceString._M_dataplus._M_p != (pointer)GLSLSourceString._M_string_length) {
        OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&msg,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&GLSLSourceString,
                      SPV_ENV_MAX,SPIRV_OPTIMIZATION_FLAG_LEGALIZATION);
        if (msg._M_dataplus._M_p == (pointer)msg._M_string_length) {
          LogError<false,char[93]>
                    (false,"CompileShaderDXC",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                     ,0x55,(char (*) [93])
                           "Failed to legalize SPIR-V shader generated from HLSL. This may result in undefined behavior."
                    );
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&GLSLSourceString,&msg);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&msg);
      }
      psVar8 = &GLSLSourceString;
      goto LAB_00224c3e;
    }
    LogError<true,char[28]>
              (false,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0xc2,(char (*) [28])"Unsupported shader compiler");
  }
  if ((this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    msg._M_dataplus._M_p._0_1_ = 0x27;
    LogError<true,char[27],char_const*,char>
              (false,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,199,(char (*) [27])"Failed to compile shader \'",
               (char **)&(this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                         .m_Desc,(char *)&msg);
  }
LAB_00224c8f:
  if ((this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_SKIP_REFLECTION) == SHADER_COMPILE_FLAG_NONE)
    {
      Allocator = GetRawAllocator();
      iVar5 = (**Allocator->_vptr_IMemoryAllocator)
                        (Allocator,0x58,"Memory for SPIRVShaderResources",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                        );
      SVar1 = (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
              .m_Desc.ShaderType;
      GLSLSourceString._M_dataplus._M_p = (pointer)Allocator;
      GLSLSourceString._M_string_length = (size_type)CONCAT44(extraout_var,iVar5);
      local_78 = &this->m_SPIRV;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,&this->m_SPIRV);
      shaderDesc = &(this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                    .m_Desc;
      if ((this->super_ShaderBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
          .m_Desc.UseCombinedTextureSamplers == false) {
        CombinedSamplerSuffix = (char *)0x0;
      }
      else {
        CombinedSamplerSuffix =
             (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
             .m_Desc.CombinedSamplerSuffix;
      }
      psVar8 = &this->m_EntryPoint;
      SPIRVShaderResources::SPIRVShaderResources
                ((SPIRVShaderResources *)CONCAT44(extraout_var,iVar5),Allocator,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,shaderDesc,
                 CombinedSamplerSuffix,SVar1 == SHADER_TYPE_VERTEX,
                 ShaderCI->LoadConstantBufferReflection,psVar8);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
      if (((ShaderCI->ByteCode == (void *)0x0) &&
          (bVar4 = std::operator==(psVar8,ShaderCI->EntryPoint), !bVar4)) &&
         ((bVar4 = std::operator==(psVar8,"main"), !bVar4 ||
          ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) ==
           SHADER_COMPILE_FLAG_NONE)))) {
        FormatString<char[26],char[173]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ShaderCI.ByteCode != nullptr || m_EntryPoint == ShaderCI.EntryPoint || (m_EntryPoint == \"main\" && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) != 0)"
                   ,(char (*) [173])shaderDesc);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xf0);
        std::__cxx11::string::~string((string *)&msg);
      }
      __p = GLSLSourceString._M_string_length;
      GLSLSourceString._M_string_length = 0;
      local_58.m_Allocator = Allocator;
      std::__shared_ptr<Diligent::SPIRVShaderResources_const,(__gnu_cxx::_Lock_policy)2>::
      reset<Diligent::SPIRVShaderResources,Diligent::STDDeleter<Diligent::SPIRVShaderResources,Diligent::IMemoryAllocator>>
                ((__shared_ptr<Diligent::SPIRVShaderResources_const,(__gnu_cxx::_Lock_policy)2> *)
                 &this->m_pShaderResources,(SPIRVShaderResources *)__p,&local_58);
      if ((SVar1 == SHADER_TYPE_VERTEX) &&
         (this_00 = (this->m_pShaderResources).
                    super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr, this_00->m_IsHLSLSource == true)) {
        SPIRVShaderResources::MapHLSLVertexShaderInputs(this_00,local_78);
      }
      std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
                ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
                 &GLSLSourceString);
    }
    else {
      std::__cxx11::string::assign((char *)&this->m_EntryPoint);
    }
    LOCK();
    (this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i = SHADER_STATUS_READY;
    UNLOCK();
  }
  return;
}

Assistant:

void ShaderVkImpl::Initialize(const ShaderCreateInfo& ShaderCI,
                              const CreateInfo&       VkShaderCI)
{
    if (ShaderCI.Source != nullptr || ShaderCI.FilePath != nullptr)
    {
        DEV_CHECK_ERR(ShaderCI.ByteCode == nullptr, "'ByteCode' must be null when shader is created from source code or a file");

        SHADER_COMPILER ShaderCompiler = ShaderCI.ShaderCompiler;
        if (ShaderCompiler == SHADER_COMPILER_DXC)
        {
            IDXCompiler* pDXCompiler = VkShaderCI.pDXCompiler;
            if (pDXCompiler == nullptr || !pDXCompiler->IsLoaded())
            {
                LOG_WARNING_MESSAGE("DX Compiler is not loaded. Using default shader compiler");
                ShaderCompiler = SHADER_COMPILER_DEFAULT;
            }
        }

        switch (ShaderCompiler)
        {
            case SHADER_COMPILER_DXC:
                m_SPIRV = CompileShaderDXC(ShaderCI, VkShaderCI);
                break;

            case SHADER_COMPILER_DEFAULT:
            case SHADER_COMPILER_GLSLANG:
                m_SPIRV = CompileShaderGLSLang(ShaderCI, VkShaderCI);
                break;

            default:
                LOG_ERROR_AND_THROW("Unsupported shader compiler");
        }

        if (m_SPIRV.empty())
        {
            LOG_ERROR_AND_THROW("Failed to compile shader '", m_Desc.Name, '\'');
        }
    }
    else if (ShaderCI.ByteCode != nullptr)
    {
        DEV_CHECK_ERR(ShaderCI.ByteCodeSize != 0, "ByteCodeSize must not be 0");
        DEV_CHECK_ERR(ShaderCI.ByteCodeSize % 4 == 0, "Byte code size (", ShaderCI.ByteCodeSize, ") is not multiple of 4");
        m_SPIRV.resize(ShaderCI.ByteCodeSize / 4);
        memcpy(m_SPIRV.data(), ShaderCI.ByteCode, ShaderCI.ByteCodeSize);
    }
    else
    {
        LOG_ERROR_AND_THROW("Shader source must be provided through one of the 'Source', 'FilePath' or 'ByteCode' members");
    }

    // We cannot create shader module here because resource bindings are assigned when
    // pipeline state is created

    // Load shader resources
    if (!m_SPIRV.empty())
    {
        if ((ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_SKIP_REFLECTION) == 0)
        {
            IMemoryAllocator& Allocator = GetRawAllocator();

            std::unique_ptr<void, STDDeleterRawMem<void>> pRawMem{
                ALLOCATE(Allocator, "Memory for SPIRVShaderResources", SPIRVShaderResources, 1),
                STDDeleterRawMem<void>(Allocator),
            };
            const bool LoadShaderInputs = m_Desc.ShaderType == SHADER_TYPE_VERTEX;
            new (pRawMem.get()) SPIRVShaderResources // May throw
                {
                    Allocator,
                    m_SPIRV,
                    m_Desc,
                    m_Desc.UseCombinedTextureSamplers ? m_Desc.CombinedSamplerSuffix : nullptr,
                    LoadShaderInputs,
                    ShaderCI.LoadConstantBufferReflection,
                    m_EntryPoint //
                };
            VERIFY_EXPR(ShaderCI.ByteCode != nullptr || m_EntryPoint == ShaderCI.EntryPoint ||
                        (m_EntryPoint == "main" && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) != 0));
            m_pShaderResources.reset(static_cast<SPIRVShaderResources*>(pRawMem.release()), STDDeleterRawMem<SPIRVShaderResources>(Allocator));

            if (LoadShaderInputs && m_pShaderResources->IsHLSLSource())
            {
                m_pShaderResources->MapHLSLVertexShaderInputs(m_SPIRV);
            }
        }
        else
        {
            m_EntryPoint = ShaderCI.EntryPoint;
        }

        m_Status.store(SHADER_STATUS_READY);
    }
}